

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_edge.h
# Opt level: O2

uint __thiscall tri_cc_t::fnext(tri_cc_t *this,uint t)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *this_00;
  string local_1c0 [32];
  stringstream ss;
  ostream local_190 [376];
  
  if ((ulong)t <
      (ulong)(((long)(this->m_tris).
                     super__Vector_base<tri_cc_t::tri,_std::allocator<tri_cc_t::tri>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(this->m_tris).super__Vector_base<tri_cc_t::tri,_std::allocator<tri_cc_t::tri>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0xc)) {
    bVar1 = has_fnext(this,t);
    if (bVar1) {
      return (this->m_tris).super__Vector_base<tri_cc_t::tri,_std::allocator<tri_cc_t::tri>_>.
             _M_impl.super__Vector_impl_data._M_start[t].fnext;
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_190,"Failed to assert condition ");
  poVar2 = std::operator<<(poVar2,"is_in_range(t,0,m_tris.size()) && has_fnext(t)");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"at (");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/tri_edge.h"
                          );
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = std::operator<<(poVar2,"fnext");
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x44);
  std::operator<<(poVar2,") \n ");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1c0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline uint fnext ( uint t ) const {ASSERT(is_in_range(t,0,m_tris.size()) && has_fnext(t));return m_tris[t].fnext;}